

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

int __thiscall Fl_Text_Buffer::insert_(Fl_Text_Buffer *this,int pos,char *text)

{
  size_t sVar1;
  int local_3c;
  int insertedLength;
  char *text_local;
  int pos_local;
  Fl_Text_Buffer *this_local;
  
  if ((text == (char *)0x0) || (*text == '\0')) {
    this_local._4_4_ = 0;
  }
  else {
    sVar1 = strlen(text);
    this_local._4_4_ = (int)sVar1;
    if (this->mGapEnd - this->mGapStart < this_local._4_4_) {
      reallocate_with_gap(this,pos,this_local._4_4_ + this->mPreferredGapSize);
    }
    else if (pos != this->mGapStart) {
      move_gap(this,pos);
    }
    memcpy(this->mBuf + pos,text,(long)this_local._4_4_);
    this->mGapStart = this_local._4_4_ + this->mGapStart;
    this->mLength = this_local._4_4_ + this->mLength;
    update_selections(this,pos,0,this_local._4_4_);
    if (this->mCanUndo != '\0') {
      if (((undowidget == this) && (undoat == pos)) && (undoinsert != 0)) {
        undoinsert = this_local._4_4_ + undoinsert;
      }
      else {
        if (undoat == pos) {
          local_3c = undocut;
        }
        else {
          local_3c = 0;
        }
        undoyankcut = local_3c;
        undoinsert = this_local._4_4_;
      }
      undoat = pos + this_local._4_4_;
      undocut = 0;
      undowidget = this;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Text_Buffer::insert_(int pos, const char *text)
{
  if (!text || !*text)
    return 0;
  
  int insertedLength = (int) strlen(text);
  
  /* Prepare the buffer to receive the new text.  If the new text fits in
   the current buffer, just move the gap (if necessary) to where
   the text should be inserted.  If the new text is too large, reallocate
   the buffer with a gap large enough to accomodate the new text and a
   gap of mPreferredGapSize */
  if (insertedLength > mGapEnd - mGapStart)
    reallocate_with_gap(pos, insertedLength + mPreferredGapSize);
  else if (pos != mGapStart)
    move_gap(pos);
  
  /* Insert the new text (pos now corresponds to the start of the gap) */
  memcpy(&mBuf[pos], text, insertedLength);
  mGapStart += insertedLength;
  mLength += insertedLength;
  update_selections(pos, 0, insertedLength);
  
  if (mCanUndo) {
    if (undowidget == this && undoat == pos && undoinsert) {
      undoinsert += insertedLength;
    } else {
      undoinsert = insertedLength;
      undoyankcut = (undoat == pos) ? undocut : 0;
    }
    undoat = pos + insertedLength;
    undocut = 0;
    undowidget = this;
  }
  
  return insertedLength;
}